

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::HttpOutputStream::writeBodyData
          (HttpOutputStream *this,ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *pPVar1;
  Promise<void> *promise;
  byte bVar2;
  PromiseArenaMember *pPVar3;
  long *plVar4;
  SourceLocation location;
  Fault node;
  bool bVar5;
  coroutine_handle<void> coroutine;
  undefined8 in_RCX;
  ArrayPtr<const_unsigned_char> *pAVar6;
  PromiseBase PVar7;
  Fault f;
  DebugExpression<bool> _kjCondition;
  char *local_58;
  char *pcStack_50;
  _func_int **local_48;
  DebugExpression<bool> local_40;
  OwnPromiseNode local_38;
  
  pAVar6 = pieces.ptr;
  coroutine._M_fr_ptr = operator_new(0x628);
  *(code **)coroutine._M_fr_ptr = writeBodyData;
  *(code **)((long)coroutine._M_fr_ptr + 8) = writeBodyData;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618) = in_RCX;
  *(size_t *)((long)coroutine._M_fr_ptr + 0x610) = pieces.size_;
  *(ArrayPtr<const_unsigned_char> **)((long)coroutine._M_fr_ptr + 0x608) = pAVar6;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "writeBodyData";
  local_48 = (_func_int **)0x15000008f6;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  location.function = "writeBodyData";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x8f6;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).currentWrapper.ptr
       = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)this_00;
  bVar2 = *(byte *)((long)&pAVar6[1].size_ + 2);
  local_40.value = (bool)(bVar2 ^ 1);
  local_38.ptr = (PromiseNode *)this;
  if (bVar2 != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32]>
              ((Fault *)&stack0xffffffffffffffa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x8f7,FAILED,"!writeInProgress","_kjCondition,\"concurrent write()s not allowed\"",
               &stack0xffffffffffffffc0,(char (*) [32])"concurrent write()s not allowed");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
  }
  local_58 = (char *)&pAVar6[1].size_;
  if ((char)pAVar6[1].size_ != '\0') {
    *(undefined1 *)((long)&pAVar6[1].size_ + 2) = 1;
    *(char **)((long)coroutine._M_fr_ptr + 0x5d8) =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    *(char **)((long)coroutine._M_fr_ptr + 0x5e0) = "writeBodyData";
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8) = 0x11000008fb;
    Promise<void>::fork((Promise<void> *)((long)coroutine._M_fr_ptr + 0x5f0));
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffa8);
    pPVar3 = (PromiseArenaMember *)pAVar6[1].ptr;
    pAVar6[1].ptr = (uchar *)local_58;
    local_58 = (char *)0x0;
    if (pPVar3 != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(pPVar3);
      node.exception = (Exception *)local_58;
      if ((Exception *)local_58 != (Exception *)0x0) {
        local_58 = (char *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
      }
    }
    PVar7.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_38.ptr;
    kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
              ((ForkedPromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238),
               (ForkedPromise<void> *)((long)coroutine._M_fr_ptr + 0x5f0));
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
    pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x268);
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
    if (!bVar5) {
      kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x280) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x288));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
      kj::_::ForkBranchBase::~ForkBranchBase((ForkBranchBase *)((long)coroutine._M_fr_ptr + 0x238));
      promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x600);
      plVar4 = *(long **)(*(long *)((long)coroutine._M_fr_ptr + 0x608) + 8);
      (**(code **)(*plVar4 + 8))
                (promise,plVar4,*(undefined8 *)((long)coroutine._M_fr_ptr + 0x610),
                 *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618));
      pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x420);
      co_await<void>(pPVar1,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 1;
      bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
      if (!bVar5) {
        kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x438) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x440));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
        pPVar3 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar3 != (PromiseArenaMember *)0x0) {
          (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar3);
        }
        *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x608) + 0x1a) = 0;
        plVar4 = *(long **)((long)coroutine._M_fr_ptr + 0x5f8);
        if (plVar4 != (long *)0x0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5f0))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x5f0),
                     (long)plVar4 + *(long *)(*plVar4 + -0x10));
        }
        kj::_::Coroutine<void>::fulfill
                  (this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x621));
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 2;
        PVar7.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_38.ptr;
      }
    }
    return (Promise<void>)(PromiseNode *)PVar7.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
            ((Fault *)&stack0xffffffffffffffc0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x8f8,FAILED,"inBody","_kjCondition,",
             (DebugExpression<bool_&> *)&stack0xffffffffffffffa8);
  kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffc0);
}

Assistant:

kj::Promise<void> writeBodyData(kj::ArrayPtr<const kj::ArrayPtr<const byte>> pieces) {
    KJ_REQUIRE(!writeInProgress, "concurrent write()s not allowed");
    KJ_REQUIRE(inBody);

    writeInProgress = true;
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();

    co_await fork;
    co_await inner.write(pieces);

    // We intentionally don't use KJ_DEFER to clean this up because if an exception is thrown, we
    // want to block further writes.
    writeInProgress = false;
  }